

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

bool absl::lts_20250127::container_internal::operator==(iterator *a,iterator *b)

{
  iterator *piVar1;
  undefined1 extraout_AL;
  ctrl_t *pcVar2;
  iterator *in_RCX;
  iterator *piVar3;
  iterator *in_RDX;
  
  if ((a == (iterator *)(kEmptyGroup + 0x10) || a == (iterator *)0x0) || (-1 < *(char *)&a->ctrl_))
  {
    if ((in_RDX != (iterator *)(kEmptyGroup + 0x10) && in_RDX != (iterator *)0x0) &&
       (*(char *)&in_RDX->ctrl_ < '\0')) goto LAB_003a9ed2;
    if (a == (iterator *)(kEmptyGroup + 0x10) && in_RDX == (iterator *)(kEmptyGroup + 0x10)) {
LAB_003a9ebb:
      return a == in_RDX;
    }
    if ((a == (iterator *)(kEmptyGroup + 0x10)) == (in_RDX == (iterator *)(kEmptyGroup + 0x10))) {
      if (a == (iterator *)0x0 || in_RDX == (iterator *)0x0) goto LAB_003a9ebb;
      if ((in_RDX == (iterator *)kSooControl) == (a == (iterator *)kSooControl)) {
        if (a == (iterator *)kSooControl) {
          if (b == in_RCX) goto LAB_003a9ebb;
        }
        else {
          piVar3 = in_RCX;
          piVar1 = in_RDX;
          if (in_RDX < a) {
            piVar3 = b;
            piVar1 = a;
            b = in_RCX;
          }
          if ((piVar1 < b) && (b <= piVar3)) goto LAB_003a9ebb;
        }
      }
      operator==();
      goto LAB_003a9ecd;
    }
  }
  else {
LAB_003a9ecd:
    operator==();
LAB_003a9ed2:
    operator==();
  }
  operator==();
  if (a == (iterator *)0x0) {
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,std::allocator<google::protobuf::Symbol>>
    ::iterator::operator*((iterator *)0x0);
  }
  else if (a != (iterator *)(kEmptyGroup + 0x10)) {
    if (-1 < *(char *)&a->ctrl_) {
      return (bool)extraout_AL;
    }
    goto LAB_003a9f03;
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,std::allocator<google::protobuf::Symbol>>
  ::iterator::operator*((iterator *)a);
LAB_003a9f03:
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,std::allocator<google::protobuf::Symbol>>
  ::iterator::operator*((iterator *)a);
  if (a == (iterator *)0x1) {
    __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x100d,
                  "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, std::allocator<const google::protobuf::FileDescriptor *>>::prefetch_heap_block() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, Alloc = std::allocator<const google::protobuf::FileDescriptor *>]"
                 );
  }
  if (a == (iterator *)0x0) {
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, std::allocator<const google::protobuf::FileDescriptor *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, Alloc = std::allocator<const google::protobuf::FileDescriptor *>]"
                 );
  }
  pcVar2 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
           ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                      *)a);
  return SUB81(pcVar2,0);
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }